

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O0

void __thiscall Emulator::update_screen(Emulator *this)

{
  bool bVar1;
  undefined4 uVar2;
  undefined1 local_2030 [28];
  int i;
  uint32_t pixels [2048];
  Emulator *this_local;
  
  if ((this->should_draw & 1U) != 0) {
    for (local_2030._20_4_ = 0; (int)local_2030._20_4_ < 0x800;
        local_2030._20_4_ = local_2030._20_4_ + 1) {
      std::bitset<2048UL>::operator[]((bitset<2048UL> *)local_2030,(size_t)&this->framebuf);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_2030);
      uVar2 = 0xff000000;
      if (bVar1) {
        uVar2 = 0xffffffff;
      }
      *(undefined4 *)(local_2030 + (long)(int)local_2030._20_4_ * 4 + 0x18) = uVar2;
      std::bitset<2048UL>::reference::~reference((reference *)local_2030);
    }
    SDL_UpdateTexture((this->sdl).texture,0,local_2030 + 0x18,0x100);
    SDL_RenderCopy((this->sdl).renderer,(this->sdl).texture,0);
    SDL_RenderPresent((this->sdl).renderer);
    this->should_draw = false;
  }
  return;
}

Assistant:

void Emulator::update_screen(){
	// Update screen only when needed
	if (!should_draw)
		return;

	// Get the pixels from the framebuf
	uint32_t pixels[FRAMEBUF_H*FRAMEBUF_W];
	for (int i = 0; i < FRAMEBUF_H*FRAMEBUF_W; i++)
		pixels[i] = (framebuf[i] ? 0xFFFFFFFF : 0xFF000000);
	
	// Draw pixels
	SDL_UpdateTexture(sdl.texture, NULL, pixels, FRAMEBUF_W*sizeof(uint32_t));
	//SDL_RenderClear(sdl.renderer);
	SDL_RenderCopy(sdl.renderer, sdl.texture, NULL, NULL);
	SDL_RenderPresent(sdl.renderer);
	
	// Update flag
	should_draw = false;
}